

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printWhile(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"while");
  space(this);
  maybeSpace(this,'(');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '(';
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar2);
  maybeSpace(this,')');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ')';
  space(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar2,"{}");
  return;
}

Assistant:

void printWhile(Ref node) {
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    print(node[2], "{}");
  }